

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void Imf_3_2::anon_unknown_0::readSampleCountForLineBlock
               (InputStreamMutex *streamData,Data *data,int lineBlockId,
               Array2D<unsigned_int> *sampleCountBuffer,int sampleCountMinY,bool writeToSlice)

{
  long *plVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  reference pvVar6;
  ArgExc *pAVar7;
  int *piVar8;
  ostream *poVar9;
  char *pcVar10;
  uint *puVar11;
  ulong uVar12;
  bool *pbVar13;
  Array2D<unsigned_int> *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  stringstream _iex_throw_s_4;
  stringstream _iex_throw_s_3;
  int count;
  int accumulatedCount;
  int x;
  int lastAccumulatedCount;
  int yInDataWindow;
  int y;
  size_t cumulative_total_samples;
  int yStride;
  int xStride;
  char *base;
  stringstream _iex_throw_s_2;
  char *readPtr;
  stringstream _iex_throw_s_1;
  uint64_t compressorMaxDataSize;
  uint64_t unpackedDataSize;
  uint64_t packedDataSize;
  stringstream _iex_throw_s;
  uint64_t sampleCountTableDataSize;
  int maxY;
  int minY;
  int partNumber;
  uint64_t *in_stack_fffffffffffff698;
  IStream *in_stack_fffffffffffff6a0;
  stringstream local_848 [16];
  ostream local_838 [376];
  stringstream local_6c0 [16];
  ostream local_6b0 [376];
  uint local_538;
  int local_534;
  int local_530;
  int local_52c;
  int local_528;
  int local_524;
  long local_520;
  int local_518;
  int local_514;
  char *local_510;
  stringstream local_508 [16];
  ostream local_4f8 [376];
  char *local_380;
  stringstream local_378 [16];
  ostream local_368 [376];
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  stringstream local_1d8 [16];
  ostream local_1c8 [376];
  ulong local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_2c;
  byte local_25;
  int local_24;
  Array2D<unsigned_int> *local_20;
  int local_14;
  long local_10;
  long local_8;
  
  local_25 = in_R9B & 1;
  plVar1 = *(long **)(in_RDI + 0x28);
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xe8),
                      (long)in_EDX);
  (**(code **)(*plVar1 + 0x30))(plVar1,*pvVar6);
  bVar3 = isMultiPart(*(int *)(local_10 + 0x60));
  if ((bVar3) &&
     (Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
                (in_stack_fffffffffffff6a0,(int *)in_stack_fffffffffffff698),
     local_2c != *(int *)(local_10 + 0x16c))) {
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar7,"Unexpected part number.");
    __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
            (in_stack_fffffffffffff6a0,(int *)in_stack_fffffffffffff698);
  if (local_40 != *(int *)(local_10 + 0xdc) + local_14 * *(int *)(local_10 + 0x168)) {
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar7,"Unexpected data block y coordinate.");
    __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  local_48 = local_40 + *(int *)(local_10 + 0x168) + -1;
  piVar8 = std::min<int>(&local_48,(int *)(local_10 + 0xe0));
  local_44 = *piVar8;
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698)
  ;
  if (local_50 <= (ulong)(long)*(int *)(local_10 + 500)) {
    Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
              (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
              (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    iVar4 = std::numeric_limits<int>::max();
    local_1f0 = (ulong)iVar4;
    if (((local_1e0 <= local_1f0) && (local_1e8 <= local_1f0)) && (local_50 <= local_1f0)) {
      plVar1 = *(long **)(local_8 + 0x28);
      pcVar10 = Array::operator_cast_to_char_((Array *)(local_10 + 0x1d8));
      (**(code **)(*plVar1 + 0x18))(plVar1,pcVar10,local_50 & 0xffffffff);
      if (local_50 < (ulong)(long)*(int *)(local_10 + 500)) {
        if (*(long *)(local_10 + 0x1e8) == 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_508);
          poVar9 = std::operator<<(local_4f8,"Deep scanline data corrupt at chunk ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_14);
          std::operator<<(poVar9," (sampleCountTableDataSize error)");
          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar7,local_508);
          __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
        plVar1 = *(long **)(local_10 + 0x1e8);
        pcVar10 = Array::operator_cast_to_char_((Array *)(local_10 + 0x1d8));
        (**(code **)(*plVar1 + 0x30))(plVar1,pcVar10,local_50 & 0xffffffff,local_40,&local_380);
      }
      else {
        local_380 = Array::operator_cast_to_char_((Array *)(local_10 + 0x1d8));
      }
      local_510 = *(char **)(local_10 + 0x1c0);
      local_514 = *(int *)(local_10 + 0x1c8);
      local_518 = *(int *)(local_10 + 0x1cc);
      local_520 = 0;
      local_524 = local_40;
      while( true ) {
        if (local_44 < local_524) {
          return;
        }
        local_528 = local_524 - *(int *)(local_10 + 0xdc);
        puVar11 = Array::operator_cast_to_unsigned_int_((Array *)(local_10 + 0x1a0));
        puVar11[local_528] = 0;
        local_52c = 0;
        for (local_530 = *(int *)(local_10 + 0xd4); local_530 <= *(int *)(local_10 + 0xd8);
            local_530 = local_530 + 1) {
          Xdr::read<Imf_3_2::CharPtrIO,char_const*>
                    ((char **)in_stack_fffffffffffff6a0,(int *)in_stack_fffffffffffff698);
          if (local_534 < local_52c) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream(local_6c0);
            poVar9 = std::operator<<(local_6b0,"Deep scanline sampleCount data corrupt at chunk ");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_14);
            std::operator<<(poVar9," (negative sample count detected)");
            pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::ArgExc::ArgExc(pAVar7,local_6c0);
            __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
          }
          uVar5 = local_534 - local_52c;
          local_52c = local_534;
          local_538 = uVar5;
          if (local_20 != (Array2D<unsigned_int> *)0x0) {
            puVar11 = Array2D<unsigned_int>::operator[](local_20,(long)(local_524 - local_24));
            puVar11[local_530 - *(int *)(local_10 + 0xd4)] = uVar5;
          }
          uVar5 = local_538;
          puVar11 = Array::operator_cast_to_unsigned_int_((Array *)(local_10 + 0x1a0));
          uVar2 = local_538;
          puVar11[local_528] = uVar5 + puVar11[local_528];
          if ((local_25 & 1) != 0) {
            puVar11 = (uint *)sampleCount(local_510,local_514,local_518,local_530,local_524);
            *puVar11 = uVar2;
          }
        }
        puVar11 = Array::operator_cast_to_unsigned_int_((Array *)(local_10 + 0x1a0));
        local_520 = (ulong)puVar11[local_528] + local_520;
        uVar12 = local_520 * *(int *)(local_10 + 0x1f0);
        if (local_1e8 <= uVar12 && uVar12 - local_1e8 != 0) break;
        pbVar13 = Array::operator_cast_to_bool_((Array *)(local_10 + 0x1b0));
        pbVar13[local_524 - *(int *)(local_10 + 0xdc)] = true;
        local_524 = local_524 + 1;
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_848);
      poVar9 = std::operator<<(local_838,"Deep scanline sampleCount data corrupt at chunk ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_14);
      poVar9 = std::operator<<(poVar9,": pixel data only contains ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1e8);
      poVar9 = std::operator<<(poVar9," bytes of data but table references at least ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_520 * *(int *)(local_10 + 0x1f0));
      std::operator<<(poVar9," bytes of sample data");
      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar7,local_848);
      __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_378);
    poVar9 = std::operator<<(local_368,"This version of the library does not");
    poVar9 = std::operator<<(poVar9,"support the allocation of data with size  > ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1f0);
    poVar9 = std::operator<<(poVar9," file table size    :");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_50);
    poVar9 = std::operator<<(poVar9," file unpacked size :");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1e8);
    poVar9 = std::operator<<(poVar9," file packed size   :");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1e0);
    std::operator<<(poVar9,".\n");
    pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar7,local_378);
    __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1d8);
  poVar9 = std::operator<<(local_1c8,"Bad sampleCountTableDataSize read from chunk ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_14);
  poVar9 = std::operator<<(poVar9,": expected ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,*(int *)(local_10 + 500));
  poVar9 = std::operator<<(poVar9," or less, got ");
  std::ostream::operator<<(poVar9,local_50);
  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar7,local_1d8);
  __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
readSampleCountForLineBlock (
    InputStreamMutex*            streamData,
    DeepScanLineInputFile::Data* data,
    int                          lineBlockId,
    Array2D<unsigned int>*       sampleCountBuffer,
    int                          sampleCountMinY,
    bool                         writeToSlice)
{
    streamData->is->seekg (data->lineOffsets[lineBlockId]);

    if (isMultiPart (data->version))
    {
        int partNumber;
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            *streamData->is, partNumber);

        if (partNumber != data->partNumber)
            throw IEX_NAMESPACE::ArgExc ("Unexpected part number.");
    }

    int minY;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*streamData->is, minY);

    //
    // Check the correctness of minY.
    //

    if (minY != data->minY + lineBlockId * data->linesInBuffer)
        throw IEX_NAMESPACE::ArgExc ("Unexpected data block y coordinate.");

    int maxY;
    maxY = min (minY + data->linesInBuffer - 1, data->maxY);

    uint64_t sampleCountTableDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, sampleCountTableDataSize);

    if (sampleCountTableDataSize >
        static_cast<uint64_t> (data->maxSampleCountTableSize))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Bad sampleCountTableDataSize read from chunk "
                << lineBlockId << ": expected " << data->maxSampleCountTableSize
                << " or less, got " << sampleCountTableDataSize);
    }

    uint64_t packedDataSize;
    uint64_t unpackedDataSize;
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, packedDataSize);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
        *streamData->is, unpackedDataSize);

    //
    // We make a check on the data size requirements here.
    // Whilst we wish to store 64bit sizes on disk, not all the compressors
    // have been made to work with such data sizes and are still limited to
    // using signed 32 bit (int) for the data size. As such, this version
    // insists that we validate that the data size does not exceed the data
    // type max limit.
    // @TODO refactor the compressor code to ensure full 64-bit support.
    //

    uint64_t compressorMaxDataSize =
        static_cast<uint64_t> (std::numeric_limits<int>::max ());
    if (packedDataSize > compressorMaxDataSize ||
        unpackedDataSize > compressorMaxDataSize ||
        sampleCountTableDataSize > compressorMaxDataSize)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "This version of the library does not"
                << "support the allocation of data with size  > "
                << compressorMaxDataSize
                << " file table size    :" << sampleCountTableDataSize
                << " file unpacked size :" << unpackedDataSize
                << " file packed size   :" << packedDataSize << ".\n");
    }

    streamData->is->read (
        data->sampleCountTableBuffer,
        static_cast<int> (sampleCountTableDataSize));

    const char* readPtr;

    //
    // If the sample count table is compressed, we'll uncompress it.
    //

    if (sampleCountTableDataSize <
        static_cast<uint64_t> (data->maxSampleCountTableSize))
    {
        if (!data->sampleCountTableComp)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Deep scanline data corrupt at chunk "
                    << lineBlockId << " (sampleCountTableDataSize error)");
        }
        data->sampleCountTableComp->uncompress (
            data->sampleCountTableBuffer,
            static_cast<int> (sampleCountTableDataSize),
            minY,
            readPtr);
    }
    else
        readPtr = data->sampleCountTableBuffer;

    char* base    = data->sampleCountSliceBase;
    int   xStride = data->sampleCountXStride;
    int   yStride = data->sampleCountYStride;

    // total number of samples in block: used to check samplecount table doesn't
    // reference more data than exists

    size_t cumulative_total_samples = 0;

    for (int y = minY; y <= maxY; y++)
    {
        int yInDataWindow                    = y - data->minY;
        data->lineSampleCount[yInDataWindow] = 0;

        int lastAccumulatedCount = 0;
        for (int x = data->minX; x <= data->maxX; x++)
        {
            int accumulatedCount, count;

            //
            // Read the sample count for pixel (x, y).
            //

            Xdr::read<CharPtrIO> (readPtr, accumulatedCount);

            // sample count table should always contain monotonically
            // increasing values.
            if (accumulatedCount < lastAccumulatedCount)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Deep scanline sampleCount data corrupt at chunk "
                        << lineBlockId << " (negative sample count detected)");
            }

            count                = accumulatedCount - lastAccumulatedCount;
            lastAccumulatedCount = accumulatedCount;

            //
            // Store the data in internal data structure.
            //

            if (sampleCountBuffer)
            {
                (*sampleCountBuffer)[y - sampleCountMinY][x - data->minX] =
                    count;
            }
            data->lineSampleCount[yInDataWindow] += count;

            //
            // Store the data in external slice
            //
            if (writeToSlice)
            {
                sampleCount (base, xStride, yStride, x, y) = count;
            }
        }
        cumulative_total_samples += data->lineSampleCount[yInDataWindow];
        if (cumulative_total_samples * data->combinedSampleSize >
            unpackedDataSize)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Deep scanline sampleCount data corrupt at chunk "
                    << lineBlockId << ": pixel data only contains "
                    << unpackedDataSize
                    << " bytes of data but table references at least "
                    << cumulative_total_samples * data->combinedSampleSize
                    << " bytes of sample data");
        }

        data->gotSampleCount[y - data->minY] = true;
    }
}